

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O2

void __thiscall
covec::Covec<float>::
update_batch_thread<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>*,std::vector<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>,std::allocator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          beg,__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              end,__normal_iterator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>_>
                  gbeg,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *gen)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer ppVar4;
  unsigned_long uVar5;
  long lVar6;
  result_type rVar7;
  size_t I;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  size_t k;
  size_t sVar11;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *grad;
  long lVar12;
  __normal_iterator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>_>
  grad_00;
  bool bVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> negative_sample;
  uniform_int_distribution<unsigned_long> keep_rate_dist;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&negative_sample,
             (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&keep_rate_dist)
  ;
  keep_rate_dist._M_param._M_b = this->dim_;
  keep_rate_dist._M_param._M_a = 1;
  grad_00._M_current = gbeg._M_current;
  for (; beg._M_current != end._M_current; beg._M_current = beg._M_current + 1) {
    if (this->chopout_enabled_ == true) {
      sVar8 = std::uniform_int_distribution<unsigned_long>::operator()(&keep_rate_dist,gen);
    }
    else {
      sVar8 = this->dim_;
    }
    accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
              (this,grad_00._M_current,beg._M_current,POSITIVE,sVar8);
    sVar11 = this->neg_size_;
    for (sVar9 = 0; grad_00._M_current = grad_00._M_current + 1, sVar9 != sVar11; sVar9 = sVar9 + 1)
    {
      lVar12 = (long)(this->num_entries_).
                     super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->num_entries_).
                     super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar10 = 0;
      while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
        rVar7 = std::discrete_distribution<int>::operator()
                          (*(discrete_distribution<int> **)
                            ((long)&(((this->probs_).
                                      super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar10 * 2),gen);
        *(long *)((long)negative_sample.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar10) = (long)rVar7;
        lVar10 = lVar10 + 8;
      }
      accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
                (this,grad_00._M_current,&negative_sample,NEGATIVE,sVar8);
    }
  }
  psVar1 = (this->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (; gbeg._M_current != grad_00._M_current; gbeg._M_current = gbeg._M_current + 1) {
    sVar8 = this->dim_;
    psVar3 = (this->vs_).
             super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar10 = 0; lVar10 != (long)psVar1 - (long)psVar2 >> 4; lVar10 = lVar10 + 1) {
      ppVar4 = ((gbeg._M_current)->
               super__Vector_base<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ppVar4[lVar10].first;
      lVar12 = *(long *)&(psVar3[lVar10].
                          super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ;
      for (sVar11 = 0; sVar8 != sVar11; sVar11 = sVar11 + 1) {
        lVar6 = *(long *)(uVar5 * 0x18 + lVar12);
        *(float *)(lVar6 + sVar11 * 4) =
             *(float *)(*(long *)&ppVar4[lVar10].second.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data + sVar11 * 4) +
             *(float *)(lVar6 + sVar11 * 4);
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&negative_sample.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void Covec<Real>::update_batch_thread(InputIterator beg, InputIterator end,
                                        GradIterator gbeg,
                                        RandomGenerator& gen)
  {
    // accumulate gradients
    std::vector<std::size_t> negative_sample(this->order());
    
    auto gitr = gbeg;
    std::uniform_int_distribution<std::size_t> keep_rate_dist(1, this->dimension());
    for(auto itr = beg; itr != end; ++itr){
      std::size_t K = this->dimension();
      if(this->chopout_enabled()){
	K = keep_rate_dist(gen);
      }
      // gradient from positive sample
      assert(gitr->size() == order() );
      assert( itr->size() == order() );
      accumulate_grad(*gitr, *itr, POSITIVE, K);
      ++gitr;
      // gradient(s) from negative sample      
      for(std::size_t m = 0, M = this->neg_size(); m < M; ++m){
        for(std::size_t i = 0, I = this->order(); i < I; ++i){
          std::size_t j = this->probs_[i]->operator()(gen);
          negative_sample[i] = j;
        }
        assert( negative_sample.size() == order() );
        accumulate_grad(*gitr, negative_sample, NEGATIVE, K);
        ++gitr;
      }
    }
    auto gend = gitr;      
    
    // update
    for(gitr = gbeg; gitr != gend; ++gitr){
      const auto& grad = *gitr;
      for(std::size_t i = 0, I = this->order(); i < I; ++i){
        auto& vs_i = *this->vs_[i];
        const auto& grad_i = grad[i];
        // update sqgs, vs
        const auto j = grad_i.first;
        const auto& grad_ij = grad_i.second;
        auto& vs_ij = vs_i[j];
        for(std::size_t k = 0, K = this->dimension(); k < K; ++k){
          vs_ij[k] += grad_ij[k];
        }
      }
    }
    
  }